

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.cxx
# Opt level: O2

bool __thiscall
cmSeparateArgumentsCommand::InitialPass
          (cmSeparateArgumentsCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  ostream *poVar4;
  char *__s;
  undefined1 uVar5;
  ulong unaff_RBP;
  size_type sVar6;
  char cVar7;
  int iVar8;
  pointer pbVar9;
  int iVar10;
  pointer pbVar11;
  char local_229;
  cmCommand *local_228;
  uint local_21c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string var;
  string command;
  ostringstream e;
  size_type local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_228 = &this->super_cmCommand;
  if (pbVar9 == pbVar11) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&e,"must be given at least one argument.",(allocator<char> *)&var);
    cmCommand::SetError(local_228,(string *)&e);
    std::__cxx11::string::~string((string *)&e);
    uVar5 = 0;
  }
  else {
    var._M_dataplus._M_p = (pointer)&var.field_2;
    var._M_string_length = 0;
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    iVar10 = 0;
    var.field_2._M_local_buf[0] = '\0';
    command.field_2._M_local_buf[0] = '\0';
    iVar8 = 1;
    for (; unaff_RBP = CONCAT71((int7)(unaff_RBP >> 8),pbVar9 == pbVar11), pbVar9 != pbVar11;
        pbVar9 = pbVar9 + 1) {
      if (iVar8 == 3) {
        iVar8 = 0;
        std::__cxx11::string::_M_assign((string *)&command);
      }
      else if (iVar8 == 2) {
        bVar3 = std::operator==(pbVar9,"NATIVE_COMMAND");
        iVar8 = 3;
        iVar10 = 1;
        if (!bVar3) {
          bVar3 = std::operator==(pbVar9,"UNIX_COMMAND");
          iVar8 = 3;
          iVar10 = 1;
          if (!bVar3) {
            bVar3 = std::operator==(pbVar9,"WINDOWS_COMMAND");
            iVar8 = 3;
            iVar10 = 2;
            if (!bVar3) goto LAB_00281f7f;
          }
        }
      }
      else {
        if (iVar8 != 1) {
LAB_00281f7f:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar4 = std::operator<<((ostream *)&e,"given unknown argument ");
          std::operator<<(poVar4,(string *)pbVar9);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(local_228,(string *)&vec);
          std::__cxx11::string::~string((string *)&vec);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
          goto LAB_00282143;
        }
        std::__cxx11::string::_M_assign((string *)&var);
        iVar8 = 2;
      }
    }
    if (iVar10 == 0) {
      __s = cmMakefile::GetDefinition(local_228->Makefile,&var);
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&e,__s,(allocator<char> *)&vec)
        ;
        vec.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT71(vec.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
        local_229 = ';';
        std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                  (_e,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )(_e + local_1a0),(char *)&vec,&local_229);
        cmMakefile::AddDefinition(local_228->Makefile,&var,_e);
        std::__cxx11::string::~string((string *)&e);
      }
    }
    else {
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (iVar10 == 1) {
        cmSystemTools::ParseUnixCommandLine(command._M_dataplus._M_p,&vec);
      }
      else {
        cmSystemTools::ParseWindowsCommandLine(command._M_dataplus._M_p,&vec);
      }
      pbVar9 = vec.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      _e = (char *)local_198;
      local_198[0]._M_local_buf[0] = '\0';
      local_21c = (uint)unaff_RBP;
      for (pbVar11 = vec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar9;
          pbVar11 = pbVar11 + 1) {
        std::__cxx11::string::append((char *)&e);
        pcVar1 = (pbVar11->_M_dataplus)._M_p;
        sVar2 = pbVar11->_M_string_length;
        for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
          cVar7 = (char)&e;
          if (pcVar1[sVar6] == ';') {
            std::__cxx11::string::push_back(cVar7);
          }
          std::__cxx11::string::push_back(cVar7);
        }
        unaff_RBP = (ulong)local_21c;
      }
      cmMakefile::AddDefinition(local_228->Makefile,&var,_e);
      std::__cxx11::string::~string((string *)&e);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vec);
    }
LAB_00282143:
    uVar5 = (undefined1)unaff_RBP;
    std::__cxx11::string::~string((string *)&command);
    std::__cxx11::string::~string((string *)&var);
  }
  return (bool)uVar5;
}

Assistant:

bool cmSeparateArgumentsCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("must be given at least one argument.");
    return false;
  }

  std::string var;
  std::string command;
  enum Mode
  {
    ModeOld,
    ModeUnix,
    ModeWindows
  };
  Mode mode = ModeOld;
  enum Doing
  {
    DoingNone,
    DoingVariable,
    DoingMode,
    DoingCommand
  };
  Doing doing = DoingVariable;
  for (std::string const& arg : args) {
    if (doing == DoingVariable) {
      var = arg;
      doing = DoingMode;
    } else if (doing == DoingMode && arg == "NATIVE_COMMAND") {
#ifdef _WIN32
      mode = ModeWindows;
#else
      mode = ModeUnix;
#endif
      doing = DoingCommand;
    } else if (doing == DoingMode && arg == "UNIX_COMMAND") {
      mode = ModeUnix;
      doing = DoingCommand;
    } else if (doing == DoingMode && arg == "WINDOWS_COMMAND") {
      mode = ModeWindows;
      doing = DoingCommand;
    } else if (doing == DoingCommand) {
      command = arg;
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "given unknown argument " << arg;
      this->SetError(e.str());
      return false;
    }
  }

  if (mode == ModeOld) {
    // Original space-replacement version of command.
    if (const char* def = this->Makefile->GetDefinition(var)) {
      std::string value = def;
      std::replace(value.begin(), value.end(), ' ', ';');
      this->Makefile->AddDefinition(var, value.c_str());
    }
  } else {
    // Parse the command line.
    std::vector<std::string> vec;
    if (mode == ModeUnix) {
      cmSystemTools::ParseUnixCommandLine(command.c_str(), vec);
    } else // if(mode == ModeWindows)
    {
      cmSystemTools::ParseWindowsCommandLine(command.c_str(), vec);
    }

    // Construct the result list value.
    std::string value;
    const char* sep = "";
    for (std::string const& vi : vec) {
      // Separate from the previous argument.
      value += sep;
      sep = ";";

      // Preserve semicolons.
      for (char si : vi) {
        if (si == ';') {
          value += '\\';
        }
        value += si;
      }
    }
    this->Makefile->AddDefinition(var, value.c_str());
  }

  return true;
}